

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

void absl::StrAppend(Nonnull<std::string_*> dest,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  bool bVar1;
  size_type sVar2;
  Nullable<const_char_*> pcVar3;
  long lVar4;
  ulong uVar5;
  string *dest_00;
  Nonnull<char_*> pcVar6;
  long lVar7;
  AlphaNum *in_RDI;
  char *out;
  char *begin;
  size_type old_size;
  size_t in_stack_ffffffffffffff28;
  AlphaNum *x;
  Nonnull<char_*> in_stack_ffffffffffffff50;
  
  sVar2 = AlphaNum::size((AlphaNum *)0x3bfd4c);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data((AlphaNum *)0x3bfd6b);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xe2,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = AlphaNum::size((AlphaNum *)0x3bfdf6);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data((AlphaNum *)0x3bfe12);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xe3,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = AlphaNum::size((AlphaNum *)0x3bfe8b);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data((AlphaNum *)0x3bfea7);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((c).size() == 0) || (uintptr_t((c).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xe4,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = AlphaNum::size((AlphaNum *)0x3bff20);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data((AlphaNum *)0x3bff3c);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((d).size() == 0) || (uintptr_t((d).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xe5,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  std::__cxx11::string::size();
  x = in_RDI;
  dest_00 = (string *)AlphaNum::size((AlphaNum *)0x3bffd7);
  AlphaNum::size((AlphaNum *)0x3bffe9);
  AlphaNum::size((AlphaNum *)0x3c0006);
  AlphaNum::size((AlphaNum *)0x3c0023);
  anon_unknown_5::STLStringAppendUninitializedAmortized(dest_00,in_stack_ffffffffffffff28);
  lVar4 = std::__cxx11::string::operator[]((ulong)in_RDI);
  anon_unknown_5::Append(in_stack_ffffffffffffff50,x);
  anon_unknown_5::Append(in_stack_ffffffffffffff50,x);
  anon_unknown_5::Append(in_stack_ffffffffffffff50,x);
  pcVar6 = anon_unknown_5::Append(in_stack_ffffffffffffff50,x);
  lVar7 = std::__cxx11::string::size();
  if (pcVar6 == (Nonnull<char_*>)(lVar4 + lVar7)) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0xef,
                "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a,
               const AlphaNum& b, const AlphaNum& c, const AlphaNum& d) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  ASSERT_NO_OVERLAP(*dest, c);
  ASSERT_NO_OVERLAP(*dest, d);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(
      dest, a.size() + b.size() + c.size() + d.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  out = Append(out, d);
  assert(out == begin + dest->size());
}